

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

int nettlp_pcie_cfg_init(nettlp_pcie_cfg *ntpc)

{
  int iVar1;
  
  iVar1 = nettlp_create_udp_socket
                    ((in_addr)(ntpc->remote_addr).s_addr,0x4001,(in_addr)(ntpc->local_addr).s_addr,
                     0x4001);
  if (-1 < iVar1) {
    ntpc->sockfd = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nettlp_pcie_cfg_init(struct nettlp_pcie_cfg *ntpc)
{
	int fd;

	fd = nettlp_create_udp_socket(ntpc->remote_addr, NETTLP_PCIE_CFG_PORT,
				      ntpc->local_addr, NETTLP_PCIE_CFG_PORT);
	if (fd < 0)
		return fd;

	ntpc->sockfd = fd;
	return 0;
}